

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O0

void __thiscall
pbrt::FormattingScene::MakeNamedMaterial
          (FormattingScene *this,string *name,ParsedParameterVector *params,FileLoc loc)

{
  bool bVar1;
  iterator iVar2;
  mapped_type *pmVar3;
  ostream *poVar4;
  ParameterDictionary *in_RSI;
  long in_RDI;
  string matName;
  string extra;
  ParameterDictionary dict;
  ParameterDictionary *in_stack_000007c8;
  string *in_stack_000007d0;
  FormattingScene *in_stack_000007d8;
  FileLoc in_stack_000007f0;
  ParameterDictionary *in_stack_fffffffffffffc58;
  ParameterDictionary *in_stack_fffffffffffffc60;
  ParsedParameter *__lhs;
  polymorphic_allocator<pbrt::ParsedParameter_*> *in_stack_fffffffffffffc70;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_stack_fffffffffffffc78;
  RGBColorSpace *in_stack_fffffffffffffc80;
  FormattingScene *in_stack_fffffffffffffc88;
  ParameterDictionary *in_stack_fffffffffffffc90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffca0;
  string *def;
  mapped_type *in_stack_fffffffffffffcb0;
  ParameterDictionary *in_stack_fffffffffffffcb8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffcc0;
  ParameterDictionary *in_stack_fffffffffffffcc8;
  undefined8 in_stack_fffffffffffffcd0;
  int indentCount;
  ParameterDictionary *this_00;
  string local_300 [32];
  string local_2e0 [32];
  string local_2c0 [32];
  string local_2a0 [32];
  string local_280 [39];
  undefined1 local_259 [33];
  ParameterDictionary *local_238;
  ParameterDictionary *pPStack_230;
  ParsedParameter *local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  undefined1 local_1f9 [40];
  undefined1 local_1d1 [33];
  string local_1b0 [32];
  string local_190 [32];
  string local_170 [32];
  string local_150 [36];
  int local_12c;
  string local_128 [32];
  _Self local_108;
  _Self local_100 [30];
  ParameterDictionary *local_10;
  
  indentCount = (int)((ulong)in_stack_fffffffffffffcd0 >> 0x20);
  this_00 = (ParameterDictionary *)&stack0x00000008;
  local_10 = in_RSI;
  pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>::polymorphic_allocator
            ((polymorphic_allocator<pbrt::ParsedParameter_*> *)in_stack_fffffffffffffc60);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::InlinedVector((InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                   *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
  ParameterDictionary::ParameterDictionary
            (in_stack_fffffffffffffc90,(ParsedParameterVector *)in_stack_fffffffffffffc88,
             in_stack_fffffffffffffc80);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::~InlinedVector(&in_stack_fffffffffffffc60->params);
  if ((*(byte *)(in_RDI + 0x11) & 1) == 0) {
    indent_abi_cxx11_(in_stack_fffffffffffffc88,(int)((ulong)in_stack_fffffffffffffc80 >> 0x20));
    Printf<std::__cxx11::string,std::__cxx11::string_const&>
              ((char *)in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc90);
    std::__cxx11::string::~string(local_170);
  }
  else {
    ParameterDictionary::RenameUsedTextures(in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
    iVar2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)in_stack_fffffffffffffc58,(key_type *)0x686a35);
    local_100[0]._M_node = iVar2._M_node;
    local_108._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_fffffffffffffc58);
    indentCount = (int)((ulong)iVar2._M_node >> 0x20);
    bVar1 = std::operator!=(local_100,&local_108);
    if (bVar1) {
      Warning<std::__cxx11::string_const&>
                ((FileLoc *)in_stack_fffffffffffffca0,(char *)in_stack_fffffffffffffc98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffc90);
      local_12c = MakeNamedMaterial::count;
      MakeNamedMaterial::count = MakeNamedMaterial::count + 1;
      StringPrintf<std::__cxx11::string_const&,int>
                ((char *)in_stack_fffffffffffffc88,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffc80,(int *)in_stack_fffffffffffffc78);
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
      std::__cxx11::string::operator=((string *)pmVar3,local_128);
      std::__cxx11::string::~string(local_128);
    }
    else {
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
      std::__cxx11::string::operator=((string *)pmVar3,(string *)local_10);
      in_stack_fffffffffffffcb8 = local_10;
    }
    indent_abi_cxx11_(in_stack_fffffffffffffc88,(int)((ulong)in_stack_fffffffffffffc80 >> 0x20));
    in_stack_fffffffffffffcb0 =
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
    Printf<std::__cxx11::string,std::__cxx11::string&>
              ((char *)in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc90);
    std::__cxx11::string::~string(local_150);
  }
  std::__cxx11::string::string(local_190);
  if ((*(byte *)(in_RDI + 0x11) & 1) != 0) {
    def = (string *)local_1d1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffca0,(char *)in_stack_fffffffffffffc98,
               (allocator<char> *)in_stack_fffffffffffffc90);
    in_stack_fffffffffffffca0 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffca0,(char *)in_stack_fffffffffffffc98,
               (allocator<char> *)in_stack_fffffffffffffc90);
    ParameterDictionary::GetOneString(in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,def);
    std::__cxx11::string::~string((string *)(local_1f9 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_1f9);
    std::__cxx11::string::~string((string *)(local_1d1 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_1d1);
    __lhs = (this_00->params).field_2.fixed[0];
    in_stack_fffffffffffffc58 = (ParameterDictionary *)(this_00->params).alloc.memoryResource;
    in_stack_fffffffffffffc60 = (ParameterDictionary *)(this_00->params).ptr;
    local_238 = in_stack_fffffffffffffc58;
    pPStack_230 = in_stack_fffffffffffffc60;
    local_228 = __lhs;
    upgradeMaterial(in_stack_000007d8,in_stack_000007d0,in_stack_000007c8,in_stack_000007f0);
    __rhs = &local_220;
    std::__cxx11::string::operator=(local_190,(string *)__rhs);
    std::__cxx11::string::~string((string *)__rhs);
    in_stack_fffffffffffffc98 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_259;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffca0,(char *)in_stack_fffffffffffffc98,(allocator<char> *)__rhs)
    ;
    ParameterDictionary::RemoveString(in_stack_fffffffffffffc60,(string *)in_stack_fffffffffffffc58)
    ;
    std::__cxx11::string::~string((string *)(local_259 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_259);
    indent_abi_cxx11_(in_stack_fffffffffffffc88,(int)((ulong)in_stack_fffffffffffffc80 >> 0x20));
    StringPrintf<std::__cxx11::string&>
              ((char *)in_stack_fffffffffffffc88,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc80);
    std::operator+(in_stack_fffffffffffffc98,__rhs);
    std::operator+(&__lhs->type,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffc60);
    std::__cxx11::string::operator=(local_190,local_280);
    std::__cxx11::string::~string(local_280);
    std::__cxx11::string::~string(local_2a0);
    std::__cxx11::string::~string(local_2e0);
    std::__cxx11::string::~string(local_2c0);
    std::__cxx11::string::~string(local_1b0);
  }
  poVar4 = std::operator<<((ostream *)&std::cout,local_190);
  ParameterDictionary::ToParameterList_abi_cxx11_(this_00,indentCount);
  std::operator<<(poVar4,local_300);
  std::__cxx11::string::~string(local_300);
  if ((*(byte *)(in_RDI + 0x11) & 1) != 0) {
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::ParameterDictionary,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::ParameterDictionary>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::ParameterDictionary,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::ParameterDictionary>_>_>
                  *)in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
    ParameterDictionary::operator=(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
  }
  std::__cxx11::string::~string(local_190);
  ParameterDictionary::~ParameterDictionary((ParameterDictionary *)0x6871ad);
  return;
}

Assistant:

void FormattingScene::MakeNamedMaterial(const std::string &name,
                                        ParsedParameterVector params, FileLoc loc) {
    ParameterDictionary dict(params, RGBColorSpace::sRGB);

    if (upgrade) {
        dict.RenameUsedTextures(definedTextures);

        if (definedNamedMaterials.find(name) != definedNamedMaterials.end()) {
            static int count = 0;
            Warning(&loc, "%s: renaming multiply-defined named material", name);
            definedNamedMaterials[name] = StringPrintf("%s-renamed-%d", name, count++);
        } else
            definedNamedMaterials[name] = name;
        Printf("%sMakeNamedMaterial \"%s\"\n", indent(), definedNamedMaterials[name]);
    } else
        Printf("%sMakeNamedMaterial \"%s\"\n", indent(), name);

    std::string extra;
    if (upgrade) {
        std::string matName = dict.GetOneString("type", "");
        extra = upgradeMaterial(&matName, &dict, loc);
        dict.RemoveString("type");
        extra = indent(1) + StringPrintf("\"string type\" [ \"%s\" ]\n", matName) + extra;
    }
    std::cout << extra << dict.ToParameterList(catIndentCount);

    if (upgrade)
        namedMaterialDictionaries[definedNamedMaterials[name]] = std::move(dict);
}